

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O2

string_stream * __thiscall
argh::parser::operator()
          (string_stream *__return_storage_ptr__,parser *this,
          initializer_list<const_char_*const> init_list)

{
  string_stream *psVar1;
  const_iterator cVar2;
  long lVar3;
  allocator local_91;
  string_stream *local_90;
  _Base_ptr local_88;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_80;
  iterator local_78;
  string local_70;
  string local_50;
  
  local_78 = init_list._M_array;
  local_80 = &this->params_;
  local_88 = &(this->params_)._M_t._M_impl.super__Rb_tree_header._M_header;
  lVar3 = 0;
  local_90 = __return_storage_ptr__;
  do {
    psVar1 = local_90;
    if (init_list._M_len << 3 == lVar3) {
      bad_stream(local_90,this);
      return psVar1;
    }
    std::__cxx11::string::string((string *)&local_70,*(char **)((long)local_78 + lVar3),&local_91);
    trim_leading_dashes(&local_50,this,&local_70);
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_80->_M_t,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    psVar1 = local_90;
    lVar3 = lVar3 + 8;
  } while (local_88 == cVar2._M_node);
  stringstream_proxy::stringstream_proxy(local_90,(string *)(cVar2._M_node + 2));
  return psVar1;
}

Assistant:

inline string_stream parser::operator()(std::initializer_list<char const* const> init_list) const
   {
      for (auto& name : init_list)
      {
         auto optIt = params_.find(trim_leading_dashes(name));
         if (params_.end() != optIt)
            return string_stream(optIt->second);
      }
      return bad_stream();
   }